

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  long *plVar1;
  Curl_cfilter *pCVar2;
  int iVar3;
  CURLcode CVar4;
  timediff_t tVar5;
  ulong uVar6;
  time_t tVar7;
  curltime older;
  curltime cVar8;
  curltime newer;
  curltime newer_00;
  curltime t;
  long local_38;
  uint uStack_30;
  undefined4 uStack_2c;
  
  local_38 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if ((*(char *)((long)&cf[3].next + 4) == '\x01') &&
     (plVar1 = (long *)cf[2].ctx, plVar1 != (long *)0x0)) {
    uVar6 = 0;
    iVar3 = (**(code **)(*plVar1 + 0x68))(plVar1,data,query,0,&local_38);
    tVar7 = 0;
    if (iVar3 != 0) goto LAB_0072373a;
    newer.tv_usec = uStack_30;
    newer.tv_sec = local_38;
    if (uStack_30 != 0 || local_38 != 0) {
      uVar6 = 0;
      newer._12_4_ = 0;
      tVar5 = Curl_timediff_us(newer,(curltime)ZEXT816(0));
      tVar7 = 0;
      if (0 < tVar5) {
        uVar6 = (ulong)uStack_30;
        tVar7 = local_38;
      }
      goto LAB_0072373a;
    }
  }
  uVar6 = 0;
  tVar7 = 0;
LAB_0072373a:
  local_38 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if ((*(char *)((long)&cf[2].cft + 4) == '\x01') &&
     (pCVar2 = cf[1].next, pCVar2 != (Curl_cfilter *)0x0)) {
    CVar4 = (*pCVar2->cft->query)(pCVar2,data,query,(int *)0x0,&local_38);
    if ((CVar4 == CURLE_OK) &&
       (newer_00.tv_usec = uStack_30, newer_00.tv_sec = local_38, uStack_30 != 0 || local_38 != 0))
    {
      older._8_8_ = uVar6;
      older.tv_sec = tVar7;
      newer_00._12_4_ = 0;
      tVar5 = Curl_timediff_us(newer_00,older);
      if (0 < tVar5) {
        uVar6 = (ulong)uStack_30;
        tVar7 = local_38;
      }
    }
  }
  cVar8._8_8_ = uVar6;
  cVar8.tv_sec = tVar7;
  return cVar8;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct Curl_cfilter *cfb;
  struct curltime t, tmax;

  memset(&tmax, 0, sizeof(tmax));
  memset(&t, 0, sizeof(t));
  cfb = ctx->h21_baller.enabled? ctx->h21_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  memset(&t, 0, sizeof(t));
  cfb = ctx->h3_baller.enabled? ctx->h3_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  return tmax;
}